

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall
flexbuffers::Builder::StringOffsetCompare::operator()
          (StringOffsetCompare *this,StringOffset *a,StringOffset *b)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  unsigned_long *puVar6;
  bool local_51;
  bool local_35;
  int cr;
  uchar *strb;
  uchar *stra;
  StringOffset *b_local;
  StringOffset *a_local;
  StringOffsetCompare *this_local;
  
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this->buf_);
  uVar1 = a->first;
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this->buf_);
  uVar2 = b->first;
  puVar6 = std::min<unsigned_long>(&a->second,&b->second);
  iVar3 = memcmp(puVar4 + uVar1,puVar5 + uVar2,*puVar6 + 1);
  local_35 = true;
  if (-1 < iVar3) {
    local_51 = false;
    if (iVar3 == 0) {
      local_51 = a->second < b->second;
    }
    local_35 = local_51;
  }
  return local_35;
}

Assistant:

bool operator()(const StringOffset &a, const StringOffset &b) const {
      auto stra = buf_->data() + a.first;
      auto strb = buf_->data() + b.first;
      auto cr = memcmp(stra, strb, (std::min)(a.second, b.second) + 1);
      return cr < 0 || (cr == 0 && a.second < b.second);
    }